

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall SignedInt_Signed_Test::TestBody(SignedInt_Signed_Test *this)

{
  ParamType_conflict2 *pPVar1;
  ScopedTrace local_11;
  SignedInt_Signed_Test *pSStack_10;
  ScopedTrace gtest_trace_283;
  SignedInt_Signed_Test *this_local;
  
  pSStack_10 = this;
  testing::ScopedTrace::ScopedTrace
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,0x11b,"SignedInt");
  pPVar1 = testing::WithParamInterface<int>::GetParam();
  anon_unknown.dwarf_131826::check<int>(*pPVar1);
  testing::ScopedTrace::~ScopedTrace(&local_11);
  return;
}

Assistant:

TEST_P (SignedInt, Signed) {
    SCOPED_TRACE ("SignedInt");
    check (GetParam ());
}